

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O1

void Extra_StringClean(char *pStrGiven,char *pCharKeep)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  char *pTemp;
  char *pcVar4;
  
  cVar1 = *pStrGiven;
  pcVar4 = pStrGiven;
  do {
    pcVar3 = pCharKeep;
    if (cVar1 == '\0') {
      *pcVar4 = '\0';
      return;
    }
    do {
      cVar2 = *pcVar3;
      if (cVar2 == '\0') break;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != cVar2);
    if (cVar2 != '\0') {
      *pcVar4 = cVar1;
      pcVar4 = pcVar4 + 1;
    }
    cVar1 = pStrGiven[1];
    pStrGiven = pStrGiven + 1;
  } while( true );
}

Assistant:

void Extra_StringClean( char * pStrGiven, char * pCharKeep )
{
    char * pTemp, * pChar, * pSave = pStrGiven;
    for ( pTemp = pStrGiven; *pTemp; pTemp++ )
    {
        for ( pChar = pCharKeep; *pChar; pChar++ )
            if ( *pTemp == *pChar )
                break;
        if ( *pChar == 0 )
            continue;
        *pSave++ = *pTemp;
    }
    *pSave = 0;
}